

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QThemeIconInfo * __thiscall
QIconLoader::findIconHelper
          (QThemeIconInfo *__return_storage_ptr__,QIconLoader *this,QString *themeName,
          QString *iconName,QStringList *visited,DashRule rule)

{
  QIconTheme *this_00;
  ulong uVar1;
  ulong uVar2;
  QSharedPointer<QIconCacheGtkReader> *pQVar3;
  QIconCacheGtkReader *this_01;
  Data *dd;
  undefined1 *puVar4;
  QArrayData *pQVar5;
  QIconDirInfo *pQVar6;
  qsizetype qVar7;
  pointer puVar8;
  pointer puVar9;
  QStringView name;
  QStringView QVar10;
  Data *pDVar11;
  int *piVar12;
  QString *pQVar13;
  Data *this_02;
  Data *pDVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Data *pDVar17;
  char cVar18;
  int iVar19;
  Stream *__old_val;
  char **ppcVar20;
  storage_type *psVar21;
  QArrayDataPointer<QIconDirInfo> *pQVar22;
  long lVar23;
  char **ppcVar24;
  char16_t *pcVar25;
  storage_type *psVar26;
  ulong uVar27;
  QIconDirInfo *args;
  long lVar28;
  char *pcVar29;
  QIconDirInfo *pQVar30;
  long in_FS_OFFSET;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QDebug local_1d0;
  QDebug local_1c8;
  QtPrivate local_1c0 [8];
  QStringBuilder<const_QString_&,_const_QString_&> local_1b8;
  QString local_1a8;
  QList<const_char_*> local_188;
  QArrayDataPointer<QIconDirInfo> local_168;
  QArrayData local_148;
  QArrayDataPointer<QString> local_138;
  QDebug local_118;
  QtPrivate local_110 [8];
  QArrayDataPointer<QIconDirInfo> local_108;
  undefined1 local_e8 [32];
  QArrayDataPointer<QIconDirInfo> local_c8;
  QIconTheme local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_a8.m_contentDirs.d.d._0_4_ = 2;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
    QMessageLogger::debug();
    pDVar11 = local_138.d;
    QVar31.m_data = (storage_type *)0xc;
    QVar31.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar31);
    QTextStream::operator<<((QTextStream *)pDVar11,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_138.d,' ');
    }
    pcVar25 = (iconName->d).ptr;
    if (pcVar25 == (char16_t *)0x0) {
      pcVar25 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_138,(ulong)pcVar25);
    if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_138.d,' ');
    }
    pDVar11 = local_138.d;
    QVar32.m_data = (storage_type *)0x8;
    QVar32.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar32);
    QTextStream::operator<<((QTextStream *)pDVar11,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_138.d,' ');
    }
    pcVar25 = (themeName->d).ptr;
    if (pcVar25 == (char16_t *)0x0) {
      pcVar25 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_138,(ulong)pcVar25);
    if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_138.d,' ');
    }
    pDVar11 = local_138.d;
    QVar33.m_data = (storage_type *)0x8;
    QVar33.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar33);
    QTextStream::operator<<((QTextStream *)pDVar11,(QString *)&local_108);
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01')
    {
      QTextStream::operator<<((QTextStream *)local_138.d,' ');
    }
    *(int *)&local_138.d[2].super_QArrayData.alloc = (int)local_138.d[2].super_QArrayData.alloc + 1;
    local_118.stream = (Stream *)0x0;
    local_108.d = (Data *)local_138.d;
    QtPrivate::printSequentialContainer<QList<QString>>
              (local_110,(Stream *)&local_108,"QList",visited);
    QDebug::~QDebug((QDebug *)&local_108);
    QDebug::~QDebug((QDebug *)local_110);
    QDebug::~QDebug(&local_118);
    QDebug::~QDebug((QDebug *)&local_138);
  }
  (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->iconName).d.size = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)visited,(visited->d).size,themeName);
  QList<QString>::end(visited);
  QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
  ::try_emplace<>((pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
                   *)&local_a8,&this->themeList,themeName);
  lVar23 = CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_) * 0x68;
  lVar28 = *(long *)(CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_) +
                    0xa0);
  this_00 = (QIconTheme *)(lVar28 + lVar23);
  if (*(char *)(lVar28 + 0x48 + lVar23) == '\0') {
    QIconTheme::QIconTheme(&local_a8,themeName);
    pDVar11 = (Data *)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    pQVar13 = (QString *)
              CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_);
    local_a8.m_contentDirs.d.d._0_4_ = 0;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    qVar7 = CONCAT44(local_a8.m_contentDirs.d.size._4_4_,(undefined4)local_a8.m_contentDirs.d.size);
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    local_108.d = (Data *)(this_00->m_contentDirs).d.d;
    (this_00->m_contentDirs).d.d = pDVar11;
    local_108.ptr = (QIconDirInfo *)(this_00->m_contentDirs).d.ptr;
    (this_00->m_contentDirs).d.ptr = pQVar13;
    local_108.size = (this_00->m_contentDirs).d.size;
    (this_00->m_contentDirs).d.size = qVar7;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_108);
    qVar7 = local_a8.m_keyList.d.size;
    pQVar6 = local_a8.m_keyList.d.ptr;
    pDVar14 = local_a8.m_keyList.d.d;
    local_a8.m_keyList.d.d = (Data *)0x0;
    local_a8.m_keyList.d.ptr = (QIconDirInfo *)0x0;
    local_a8.m_keyList.d.size = 0;
    local_108.d = (this_00->m_keyList).d.d;
    (this_00->m_keyList).d.d = pDVar14;
    local_108.ptr = (this_00->m_keyList).d.ptr;
    (this_00->m_keyList).d.ptr = pQVar6;
    local_108.size = (this_00->m_keyList).d.size;
    (this_00->m_keyList).d.size = qVar7;
    QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_108);
    qVar7 = local_a8.m_parents.d.size;
    pQVar13 = local_a8.m_parents.d.ptr;
    pDVar11 = local_a8.m_parents.d.d;
    local_a8.m_parents.d.d = (Data *)0x0;
    local_a8.m_parents.d.ptr = (QString *)0x0;
    local_a8.m_parents.d.size = 0;
    local_108.d = (Data *)(this_00->m_parents).d.d;
    (this_00->m_parents).d.d = pDVar11;
    local_108.ptr = (QIconDirInfo *)(this_00->m_parents).d.ptr;
    (this_00->m_parents).d.ptr = pQVar13;
    local_108.size = (this_00->m_parents).d.size;
    (this_00->m_parents).d.size = qVar7;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_108);
    qVar7 = local_a8.m_gtkCaches.d.size;
    pQVar3 = local_a8.m_gtkCaches.d.ptr;
    pDVar17 = local_a8.m_gtkCaches.d.d;
    this_00->m_valid = local_a8.m_valid;
    local_a8.m_gtkCaches.d.d = (Data *)0x0;
    local_a8.m_gtkCaches.d.ptr = (QSharedPointer<QIconCacheGtkReader> *)0x0;
    local_a8.m_gtkCaches.d.size = 0;
    local_108.d = (Data *)(this_00->m_gtkCaches).d.d;
    (this_00->m_gtkCaches).d.d = pDVar17;
    local_108.ptr = (QIconDirInfo *)(this_00->m_gtkCaches).d.ptr;
    (this_00->m_gtkCaches).d.ptr = pQVar3;
    local_108.size = (this_00->m_gtkCaches).d.size;
    (this_00->m_gtkCaches).d.size = qVar7;
    QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_>::~QArrayDataPointer
              ((QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_> *)&local_108);
    QArrayDataPointer<QSharedPointer<QIconCacheGtkReader>_>::~QArrayDataPointer
              (&local_a8.m_gtkCaches.d);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8.m_parents.d);
    QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_a8.m_keyList.d);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
    if (this_00->m_valid == false) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_a8.m_contentDirs.d.d._0_4_ = 2;
        local_a8.m_contentDirs.d.d._4_4_ = 0;
        local_a8.m_contentDirs.d.ptr._0_4_ = 0;
        local_a8.m_contentDirs.d.ptr._4_4_ = 0;
        local_a8.m_contentDirs.d.size._0_4_ = 0;
        local_a8.m_contentDirs.d.size._4_4_ = 0;
        local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
        QMessageLogger::debug();
        pDVar11 = local_138.d;
        QVar47.m_data = &DAT_00000005;
        QVar47.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar47);
        QTextStream::operator<<((QTextStream *)pDVar11,(QString *)&local_108);
        if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_138.d,' ');
        }
        pcVar25 = (themeName->d).ptr;
        if (pcVar25 == (char16_t *)0x0) {
          pcVar25 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_138,(ulong)pcVar25);
        if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_138.d,' ');
        }
        pDVar11 = local_138.d;
        QVar48.m_data = (storage_type *)0x9;
        QVar48.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar48);
        QTextStream::operator<<((QTextStream *)pDVar11,(QString *)&local_108);
        if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_138.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_138.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_138);
      }
      goto LAB_0027c405;
    }
  }
  local_138.d = (this_00->m_contentDirs).d.d;
  local_138.ptr = (this_00->m_contentDirs).d.ptr;
  local_138.size = (this_00->m_contentDirs).d.size;
  if (&(local_138.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_138.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_138.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148.alloc = (qsizetype)(iconName->d).ptr;
  uVar1 = (iconName->d).size;
  local_148._0_8_ = uVar1;
  if ((__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = (this->m_iconName).d.size;
    local_a8.m_contentDirs.d.size._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.size._4_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.d._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.d._4_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0xaaaaaaaa;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0xaaaaaaaa;
    local_108.ptr = (QIconDirInfo *)0x4;
    local_108.size = 0x685aee;
    local_108.d = (Data *)&local_148;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_a8,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_108);
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.ptr = (QIconDirInfo *)0x4;
    local_168.size = 0x6bfa32;
    local_168.d = (Data *)&local_148;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_168);
    if (local_138.size != 0) {
      uVar27 = 0;
      do {
        local_168.d = (this_00->m_keyList).d.d;
        local_168.ptr = (this_00->m_keyList).d.ptr;
        local_168.size = (this_00->m_keyList).d.size;
        if (&(local_168.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((local_168.d)->super_QArrayData).ref_)->d =
               *(int *)&((DataPointer *)&((local_168.d)->super_QArrayData).ref_)->d + 1;
          UNLOCK();
        }
        pQVar3 = (this_00->m_gtkCaches).d.ptr;
        this_01 = pQVar3[uVar27].value.ptr;
        dd = pQVar3[uVar27].d;
        if (dd != (Data *)0x0) {
          LOCK();
          (dd->weakref)._q_value.super___atomic_base<int>._M_i =
               (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (dd->strongref)._q_value.super___atomic_base<int>._M_i =
               (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (this_01->m_isValid == true) {
          local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_188.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
          name.m_data = (storage_type_conflict *)local_148.alloc;
          name.m_size._0_4_ = local_148.ref_._q_value.super___atomic_base<int>._M_i;
          name.m_size._4_4_ =
               local_148.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i;
          QIconCacheGtkReader::lookup(&local_188,this_01,name);
          if (this_01->m_isValid == true) {
            local_c8.d = local_168.d;
            local_c8.ptr = local_168.ptr;
            local_c8.size = local_168.size;
            if (&(local_168.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&(local_168.d)->super_QArrayData)->d =
                   *(int *)&((DataPointer *)&(local_168.d)->super_QArrayData)->d + 1;
              UNLOCK();
            }
            QList<QIconDirInfo>::clear((QList<QIconDirInfo> *)&local_168);
            QList<QIconDirInfo>::reserve((QList<QIconDirInfo> *)&local_168,local_188.d.size);
            if ((undefined1 *)local_188.d.size != (undefined1 *)0x0) {
              ppcVar20 = local_188.d.ptr + local_188.d.size;
              ppcVar24 = local_188.d.ptr;
              do {
                local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                if (*ppcVar24 == (char *)0x0) {
                  psVar26 = (storage_type *)0x0;
                }
                else {
                  psVar21 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar26 = psVar21 + 1;
                    pcVar29 = *ppcVar24 + 1 + (long)psVar21;
                    psVar21 = psVar26;
                  } while (*pcVar29 != '\0');
                }
                QVar34.m_data = psVar26;
                QVar34.m_size = (qsizetype)local_e8;
                QString::fromUtf8(QVar34);
                uVar16 = local_e8._16_8_;
                uVar15 = local_e8._8_8_;
                pQVar6 = local_c8.ptr + local_c8.size;
                pQVar30 = local_c8.ptr;
                if (0 < local_c8.size >> 2) {
                  lVar28 = (local_c8.size >> 2) + 1;
                  pQVar30 = local_c8.ptr + 2;
                  do {
                    args = pQVar30;
                    puVar4 = (undefined1 *)args[-2].path.d.size;
                    if ((puVar4 == (undefined1 *)uVar16) &&
                       (QVar35.m_data = args[-2].path.d.ptr, QVar35.m_size = (qsizetype)puVar4,
                       QVar49.m_data = (storage_type_conflict *)uVar15, QVar49.m_size = uVar16,
                       cVar18 = QtPrivate::equalStrings(QVar35,QVar49), cVar18 != '\0')) {
                      args = args + -2;
                      goto LAB_0027b73d;
                    }
                    puVar4 = (undefined1 *)args[-1].path.d.size;
                    if ((puVar4 == (undefined1 *)uVar16) &&
                       (QVar36.m_data = args[-1].path.d.ptr, QVar36.m_size = (qsizetype)puVar4,
                       QVar50.m_data = (storage_type_conflict *)uVar15, QVar50.m_size = uVar16,
                       cVar18 = QtPrivate::equalStrings(QVar36,QVar50), cVar18 != '\0')) {
                      args = args + -1;
                      goto LAB_0027b73d;
                    }
                    puVar4 = (undefined1 *)(args->path).d.size;
                    if ((puVar4 == (undefined1 *)uVar16) &&
                       (QVar37.m_data = (args->path).d.ptr, QVar37.m_size = (qsizetype)puVar4,
                       QVar51.m_data = (storage_type_conflict *)uVar15, QVar51.m_size = uVar16,
                       cVar18 = QtPrivate::equalStrings(QVar37,QVar51), cVar18 != '\0'))
                    goto LAB_0027b73d;
                    puVar4 = (undefined1 *)args[1].path.d.size;
                    if ((puVar4 == (undefined1 *)uVar16) &&
                       (QVar38.m_data = args[1].path.d.ptr, QVar38.m_size = (qsizetype)puVar4,
                       QVar52.m_data = (storage_type_conflict *)uVar15, QVar52.m_size = uVar16,
                       cVar18 = QtPrivate::equalStrings(QVar38,QVar52), cVar18 != '\0')) {
                      args = args + 1;
                      goto LAB_0027b73d;
                    }
                    lVar28 = lVar28 + -1;
                    pQVar30 = args + 4;
                  } while (1 < lVar28);
                  pQVar30 = args + 2;
                }
                lVar28 = ((long)pQVar6 - (long)pQVar30 >> 3) * -0x3333333333333333;
                if (lVar28 == 1) {
LAB_0027b6f0:
                  puVar4 = (undefined1 *)(pQVar30->path).d.size;
                  args = pQVar6;
                  if ((puVar4 == (undefined1 *)local_e8._16_8_) &&
                     (QVar41.m_data = (pQVar30->path).d.ptr, QVar41.m_size = (qsizetype)puVar4,
                     QVar55.m_data = (storage_type_conflict *)local_e8._8_8_,
                     QVar55.m_size = local_e8._16_8_,
                     cVar18 = QtPrivate::equalStrings(QVar41,QVar55), args = pQVar30, cVar18 == '\0'
                     )) {
                    args = pQVar6;
                  }
                }
                else if (lVar28 == 2) {
LAB_0027b6c6:
                  puVar4 = (undefined1 *)(pQVar30->path).d.size;
                  if ((puVar4 != (undefined1 *)local_e8._16_8_) ||
                     (QVar40.m_data = (pQVar30->path).d.ptr, QVar40.m_size = (qsizetype)puVar4,
                     QVar54.m_data = (storage_type_conflict *)local_e8._8_8_,
                     QVar54.m_size = local_e8._16_8_,
                     cVar18 = QtPrivate::equalStrings(QVar40,QVar54), args = pQVar30, cVar18 == '\0'
                     )) {
                    pQVar30 = pQVar30 + 1;
                    goto LAB_0027b6f0;
                  }
                }
                else {
                  args = pQVar6;
                  if ((lVar28 == 3) &&
                     ((puVar4 = (undefined1 *)(pQVar30->path).d.size,
                      puVar4 != (undefined1 *)local_e8._16_8_ ||
                      (QVar39.m_data = (pQVar30->path).d.ptr, QVar39.m_size = (qsizetype)puVar4,
                      QVar53.m_data = (storage_type_conflict *)local_e8._8_8_,
                      QVar53.m_size = local_e8._16_8_,
                      cVar18 = QtPrivate::equalStrings(QVar39,QVar53), args = pQVar30,
                      cVar18 == '\0')))) {
                    pQVar30 = pQVar30 + 1;
                    goto LAB_0027b6c6;
                  }
                }
LAB_0027b73d:
                if (args != pQVar6) {
                  QtPrivate::QMovableArrayOps<QIconDirInfo>::emplace<QIconDirInfo_const&>
                            ((QMovableArrayOps<QIconDirInfo> *)&local_168,local_168.size,args);
                  QList<QIconDirInfo>::end((QList<QIconDirInfo> *)&local_168);
                }
                if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                  }
                }
                ppcVar24 = ppcVar24 + 1;
              } while (ppcVar24 != ppcVar20);
            }
            QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_c8);
          }
          if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,8,0x10);
            }
          }
        }
        local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d = (Data *)(local_138.ptr + uVar27);
        local_c8.ptr = (QIconDirInfo *)CONCAT62(local_c8.ptr._2_6_,0x2f);
        QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                  ((QString *)&local_188,(QStringBuilder<const_QString_&,_char16_t> *)&local_c8);
        if ((char *)local_168.size != (char *)0x0) {
          lVar28 = 0;
          pcVar29 = (char *)0x0;
          do {
            pQVar6 = local_168.ptr;
            if ((uVar2 <= uVar1) || (1 < (byte)((&(local_168.ptr)->context)[lVar28] - Applications))
               ) {
              pQVar13 = (QString *)((long)&((local_168.ptr)->path).d.d + lVar28);
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
              local_e8._0_8_ = &local_188;
              local_e8._16_2_ = L'/';
              local_e8._8_8_ = pQVar13;
              QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t>::
              convertTo<QString>((QString *)&local_c8,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t>
                                  *)local_e8);
              local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8.d.ptr = (char16_t *)&local_108;
              local_1a8.d.d = (Data *)&local_c8;
              QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                        ((QString *)local_e8,
                         (QStringBuilder<const_QString_&,_const_QString_&> *)&local_1a8);
              cVar18 = QFile::exists((QString *)local_e8);
              if (cVar18 == '\0') {
                if (this->m_supportsSvg == true) {
                  local_1a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_1a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1b8.a = (QString *)&local_c8;
                  local_1b8.b = (QString *)&local_a8;
                  QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                            (&local_1a8,&local_1b8);
                  cVar18 = QFile::exists(&local_1a8);
                  if (cVar18 != '\0') {
                    pQVar22 = (QArrayDataPointer<QIconDirInfo> *)operator_new(0x50);
                    pQVar22[2].d = (Data *)0x0;
                    pQVar22[2].ptr = (QIconDirInfo *)0x0;
                    pQVar22[1].ptr = (QIconDirInfo *)0x0;
                    pQVar22[1].size = 0;
                    pQVar22->size = 0;
                    pQVar22[1].d = (Data *)0x0;
                    pQVar22->d = (Data *)0x0;
                    pQVar22->ptr = (QIconDirInfo *)0x0;
                    pQVar22[2].size = 0;
                    pQVar22[3].d = (Data *)0x0;
                    pQVar22[1].size = 0;
                    pQVar22[2].d = (Data *)0x0;
                    pQVar22[1].d = (Data *)0x0;
                    pQVar22[1].ptr = (QIconDirInfo *)0x0;
                    pQVar22->ptr = (QIconDirInfo *)0x0;
                    pQVar22->size = 0;
                    pQVar22[2].ptr = (QIconDirInfo *)0x0;
                    *(undefined4 *)&pQVar22[2].size = 0x20001;
                    pQVar22->d = (Data *)&PTR__ScalableEntry_007e2ec0;
                    QIcon::QIcon((QIcon *)(pQVar22 + 3));
                    QString::operator=((QString *)&pQVar22[1].ptr,pQVar13);
                    pQVar22[2].ptr = *(QIconDirInfo **)((long)&pQVar6->size + lVar28);
                    *(undefined4 *)&pQVar22[2].size = *(undefined4 *)((long)&pQVar6->scale + lVar28)
                    ;
                    QString::operator=((QString *)&pQVar22->ptr,&local_1a8);
                    local_1b8.a = (QString *)pQVar22;
                    std::
                    vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                    ::
                    emplace_back<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>
                              ((vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                                *)__return_storage_ptr__,
                               (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                                *)&local_1b8);
                    if ((QArrayDataPointer<QIconDirInfo> *)local_1b8.a !=
                        (QArrayDataPointer<QIconDirInfo> *)0x0) {
                      (*(code *)((*(Data **)&(local_1b8.a)->d)->super_QArrayData).alloc)();
                    }
                  }
                  if ((QArrayDataPointer<QIconDirInfo> *)local_1a8.d.d !=
                      (QArrayDataPointer<QIconDirInfo> *)0x0) {
                    LOCK();
                    *(int *)&(local_1a8.d.d)->super_QArrayData =
                         *(int *)&(local_1a8.d.d)->super_QArrayData + -1;
                    UNLOCK();
                    if (*(int *)&(local_1a8.d.d)->super_QArrayData == 0) {
                      QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
              }
              else {
                pQVar22 = (QArrayDataPointer<QIconDirInfo> *)operator_new(0x60);
                ((DataPointer *)&pQVar22[2].d)->d = (Data *)0x0;
                pQVar22[2].ptr = (QIconDirInfo *)0x0;
                pQVar22[1].ptr = (QIconDirInfo *)0x0;
                pQVar22[1].size = 0;
                pQVar22->size = 0;
                ((DataPointer *)&pQVar22[1].d)->d = (Data *)0x0;
                ((DataPointer *)&pQVar22->d)->d = (Data *)0x0;
                pQVar22->ptr = (QIconDirInfo *)0x0;
                pQVar22[2].size = 0;
                ((DataPointer *)&pQVar22[3].d)->d = (Data *)0x0;
                pQVar22[3].ptr = (QIconDirInfo *)0x0;
                pQVar22[3].size = 0;
                pQVar22[1].size = 0;
                ((DataPointer *)&pQVar22[2].d)->d = (Data *)0x0;
                ((DataPointer *)&pQVar22[1].d)->d = (Data *)0x0;
                pQVar22[1].ptr = (QIconDirInfo *)0x0;
                pQVar22->ptr = (QIconDirInfo *)0x0;
                pQVar22->size = 0;
                pQVar22[2].ptr = (QIconDirInfo *)0x0;
                *(undefined4 *)&pQVar22[2].size = 0x20001;
                ((DataPointer *)&pQVar22->d)->d = (Data *)&PTR__PixmapEntry_007e2e80;
                QPixmap::QPixmap((QPixmap *)(pQVar22 + 3));
                QString::operator=((QString *)&pQVar22[1].ptr,pQVar13);
                pQVar22[2].ptr = *(QIconDirInfo **)((long)&pQVar6->size + lVar28);
                *(undefined4 *)&pQVar22[2].size = *(undefined4 *)((long)&pQVar6->scale + lVar28);
                QString::operator=((QString *)&pQVar22->ptr,(QString *)local_e8);
                local_1a8.d.d = (Data *)pQVar22;
                std::
                vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                ::_M_insert_rval(&__return_storage_ptr__->entries,
                                 (__return_storage_ptr__->entries).
                                 super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_1a8)
                ;
                if ((QArrayDataPointer<QIconDirInfo> *)local_1a8.d.d !=
                    (QArrayDataPointer<QIconDirInfo> *)0x0) {
                  (*(code *)(((DataPointer *)&(local_1a8.d.d)->super_QArrayData)->d->
                            super_QArrayData).alloc)();
                }
              }
              if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                }
              }
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
            }
            pcVar29 = pcVar29 + 1;
            lVar28 = lVar28 + 0x28;
          } while (pcVar29 < (ulong)local_168.size);
        }
        if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
          }
        }
        QSharedPointer<QIconCacheGtkReader>::deref(dd);
        QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_168);
        uVar27 = uVar27 + 1;
      } while (uVar27 < (ulong)local_138.size);
    }
    if ((__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      QString::QString((QString *)&local_168,(QChar *)local_148.alloc,local_148._0_8_);
      pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
      pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
      (__return_storage_ptr__->iconName).d.d = (Data *)local_168.d;
      (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_168.ptr;
      pcVar29 = (char *)(__return_storage_ptr__->iconName).d.size;
      (__return_storage_ptr__->iconName).d.size = local_168.size;
      local_168.d = (Data *)pQVar5;
      local_168.ptr = pQVar6;
      local_168.size = (qsizetype)pcVar29;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
    }
    if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
      }
    }
    piVar12 = (int *)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_),2,
                   0x10);
      }
    }
  }
  if ((__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
    QIconTheme::parents((QStringList *)&local_168,this_00);
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a8.m_contentDirs.d.d._0_4_ = 2;
      local_a8.m_contentDirs.d.d._4_4_ = 0;
      local_a8.m_contentDirs.d.ptr._0_4_ = 0;
      local_a8.m_contentDirs.d.ptr._4_4_ = 0;
      local_a8.m_contentDirs.d.size._0_4_ = 0;
      local_a8.m_contentDirs.d.size._4_4_ = 0;
      local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
      QMessageLogger::debug();
      pDVar14 = local_c8.d;
      QVar42.m_data = (storage_type *)0x25;
      QVar42.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar42);
      QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
         ) {
        QTextStream::operator<<((QTextStream *)local_c8.d,' ');
      }
      pDVar14 = local_c8.d;
      QVar43.m_data = (storage_type *)0x14;
      QVar43.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar43);
      QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
         ) {
        QTextStream::operator<<((QTextStream *)local_c8.d,' ');
      }
      *(int *)&local_c8.d[2].super_QArrayData.alloc = (int)local_c8.d[2].super_QArrayData.alloc + 1;
      local_1d0.stream = (Stream *)0x0;
      local_108.d = local_c8.d;
      QtPrivate::printSequentialContainer<QList<QString>>
                ((QtPrivate *)&local_188,(Stream *)&local_108,"QList",(QList<QString> *)&local_168);
      QDebug::~QDebug((QDebug *)&local_108);
      this_02 = local_188.d.d;
      QVar44.m_data = (storage_type *)0x10;
      QVar44.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar44);
      QTextStream::operator<<((QTextStream *)this_02,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_188.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_188.d.d,' ');
      }
      *(int *)&local_188.d.d[2].super_QArrayData.alloc =
           (int)local_188.d.d[2].super_QArrayData.alloc + 1;
      local_1c8.stream = (Stream *)0x0;
      local_108.d = (Data *)local_188.d.d;
      QtPrivate::printSequentialContainer<QList<QString>>
                (local_1c0,(Stream *)&local_108,"QList",visited);
      QDebug::~QDebug((QDebug *)&local_108);
      QDebug::~QDebug((QDebug *)local_1c0);
      QDebug::~QDebug(&local_1c8);
      QDebug::~QDebug((QDebug *)&local_188);
      QDebug::~QDebug(&local_1d0);
      QDebug::~QDebug((QDebug *)&local_c8);
    }
    if ((char *)local_168.size != (char *)0x0) {
      pcVar29 = (char *)0x0;
      do {
        local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        QString::trimmed_helper((QString *)&local_188);
        QVar56.m_data = (storage_type_conflict *)local_188.d.ptr;
        QVar56.m_size = local_188.d.size;
        cVar18 = QtPrivate::QStringList_contains((QList_conflict *)visited,QVar56,CaseSensitive);
        if (cVar18 == '\0') {
          findIconHelper((QThemeIconInfo *)&local_a8,this,(QString *)&local_188,iconName,visited,
                         NoFallBack);
          local_108.d = (Data *)(__return_storage_ptr__->entries).
                                super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
          local_108.ptr =
               (QIconDirInfo *)
               (__return_storage_ptr__->entries).
               super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_108.size =
               (qsizetype)
               (__return_storage_ptr__->entries).
               super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,
                                 local_a8.m_contentDirs.d.ptr._0_4_);
          (__return_storage_ptr__->entries).
          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(local_a8.m_contentDirs.d.size._4_4_,
                                 (undefined4)local_a8.m_contentDirs.d.size);
          local_a8.m_contentDirs.d.d._0_4_ = 0;
          local_a8.m_contentDirs.d.d._4_4_ = 0;
          local_a8.m_contentDirs.d.ptr._0_4_ = 0;
          local_a8.m_contentDirs.d.ptr._4_4_ = 0;
          local_a8.m_contentDirs.d.size._0_4_ = 0;
          local_a8.m_contentDirs.d.size._4_4_ = 0;
          std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                     *)&local_108);
          pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
          pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
          (__return_storage_ptr__->iconName).d.d = (Data *)local_a8.m_keyList.d.d;
          (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_a8.m_keyList.d.ptr;
          qVar7 = (__return_storage_ptr__->iconName).d.size;
          (__return_storage_ptr__->iconName).d.size = local_a8.m_keyList.d.size;
          local_a8.m_keyList.d.d = (Data *)pQVar5;
          local_a8.m_keyList.d.ptr = pQVar6;
          local_a8.m_keyList.d.size = qVar7;
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
          std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                     *)&local_a8);
        }
        puVar8 = (__return_storage_ptr__->entries).
                 super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar9 = (__return_storage_ptr__->entries).
                 super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
          }
        }
      } while ((puVar8 == puVar9) && (pcVar29 = pcVar29 + 1, pcVar29 < (ulong)local_168.size));
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_168);
  }
  if (((rule == FallBack) &&
      ((__return_storage_ptr__->entries).
       super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->entries).
       super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (QVar10.m_data = (storage_type_conflict *)local_148.alloc,
     QVar10.m_size._0_4_ = local_148.ref_._q_value.super___atomic_base<int>._M_i,
     QVar10.m_size._4_4_ =
          local_148.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
          super_QFlagsStorage<QArrayData::ArrayOption>.i,
     iVar19 = QtPrivate::lastIndexOf(QVar10,-1,L'-',CaseSensitive), iVar19 != -1)) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a8.m_contentDirs.d.d._0_4_ = 2;
      local_a8.m_contentDirs.d.d._4_4_ = 0;
      local_a8.m_contentDirs.d.ptr._0_4_ = 0;
      local_a8.m_contentDirs.d.ptr._4_4_ = 0;
      local_a8.m_contentDirs.d.size._0_4_ = 0;
      local_a8.m_contentDirs.d.size._4_4_ = 0;
      local_a8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
      QMessageLogger::debug();
      pDVar14 = local_168.d;
      QVar45.m_data = (storage_type *)0x2a;
      QVar45.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar45);
      QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_168.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_168.d,' ');
      }
      pDVar14 = local_168.d;
      QVar46.m_data = (storage_type *)0x14;
      QVar46.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar46);
      QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_108);
      if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_168.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_168.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_168);
    }
    local_148._0_8_ = SEXT48(iVar19);
    local_168.d = (Data *)0x0;
    local_168.ptr = (QIconDirInfo *)0x0;
    local_168.size = 0;
    QString::QString((QString *)&local_188,(QChar *)local_148.alloc,local_148._0_8_);
    findIconHelper((QThemeIconInfo *)&local_a8,this,themeName,(QString *)&local_188,
                   (QStringList *)&local_168,FallBack);
    local_108.d = (Data *)(__return_storage_ptr__->entries).
                          super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    local_108.ptr =
         (QIconDirInfo *)
         (__return_storage_ptr__->entries).
         super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_108.size =
         (qsizetype)
         (__return_storage_ptr__->entries).
         super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.d._4_4_,local_a8.m_contentDirs.d.d._0_4_);
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.ptr._4_4_,local_a8.m_contentDirs.d.ptr._0_4_);
    (__return_storage_ptr__->entries).
    super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_a8.m_contentDirs.d.size._4_4_,
                           (undefined4)local_a8.m_contentDirs.d.size);
    local_a8.m_contentDirs.d.d._0_4_ = 0;
    local_a8.m_contentDirs.d.d._4_4_ = 0;
    local_a8.m_contentDirs.d.ptr._0_4_ = 0;
    local_a8.m_contentDirs.d.ptr._4_4_ = 0;
    local_a8.m_contentDirs.d.size._0_4_ = 0;
    local_a8.m_contentDirs.d.size._4_4_ = 0;
    std::
    vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               *)&local_108);
    pQVar5 = &((__return_storage_ptr__->iconName).d.d)->super_QArrayData;
    pQVar6 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
    (__return_storage_ptr__->iconName).d.d = (Data *)local_a8.m_keyList.d.d;
    (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_a8.m_keyList.d.ptr;
    qVar7 = (__return_storage_ptr__->iconName).d.size;
    (__return_storage_ptr__->iconName).d.size = local_a8.m_keyList.d.size;
    local_a8.m_keyList.d.d = (Data *)pQVar5;
    local_a8.m_keyList.d.ptr = pQVar6;
    local_a8.m_keyList.d.size = qVar7;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    std::
    vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
    ::~vector((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               *)&local_a8);
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_168);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
LAB_0027c405:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QThemeIconInfo QIconLoader::findIconHelper(const QString &themeName,
                                           const QString &iconName,
                                           QStringList &visited,
                                           DashRule rule) const
{
    qCDebug(lcIconLoader) << "Finding icon" << iconName << "in theme" << themeName
                          << "skipping" << visited;

    QThemeIconInfo info;
    Q_ASSERT(!themeName.isEmpty());

    // Used to protect against potential recursions
    visited << themeName;

    QIconTheme &theme = themeList[themeName];
    if (!theme.isValid()) {
        theme = QIconTheme(themeName);
        if (!theme.isValid()) {
            qCDebug(lcIconLoader) << "Theme" << themeName << "not found";
            return info;
        }
    }

    const QStringList contentDirs = theme.contentDirs();

    QStringView iconNameFallback(iconName);
    bool searchingGenericFallback = m_iconName.length() > iconName.length();

    // Iterate through all icon's fallbacks in current theme
    if (info.entries.empty()) {
        const QString svgIconName = iconNameFallback + ".svg"_L1;
        const QString pngIconName = iconNameFallback + ".png"_L1;

        // Add all relevant files
        for (int i = 0; i < contentDirs.size(); ++i) {
            QList<QIconDirInfo> subDirs = theme.keyList();

            // Try to reduce the amount of subDirs by looking in the GTK+ cache in order to save
            // a massive amount of file stat (especially if the icon is not there)
            auto cache = theme.m_gtkCaches.at(i);
            if (cache->isValid()) {
                const auto result = cache->lookup(iconNameFallback);
                if (cache->isValid()) {
                    const QList<QIconDirInfo> subDirsCopy = subDirs;
                    subDirs.clear();
                    subDirs.reserve(result.size());
                    for (const char *s : result) {
                        QString path = QString::fromUtf8(s);
                        auto it = std::find_if(subDirsCopy.cbegin(), subDirsCopy.cend(),
                                               [&](const QIconDirInfo &info) {
                                                   return info.path == path; } );
                        if (it != subDirsCopy.cend()) {
                            subDirs.append(*it);
                        }
                    }
                }
            }

            QString contentDir = contentDirs.at(i) + u'/';
            for (int j = 0; j < subDirs.size() ; ++j) {
                const QIconDirInfo &dirInfo = subDirs.at(j);
                if (searchingGenericFallback &&
                        (dirInfo.context == QIconDirInfo::Applications ||
                         dirInfo.context == QIconDirInfo::MimeTypes))
                    continue;

                const QString subDir = contentDir + dirInfo.path + u'/';
                const QString pngPath = subDir + pngIconName;
                if (QFile::exists(pngPath)) {
                    auto iconEntry = std::make_unique<PixmapEntry>();
                    iconEntry->dir = dirInfo;
                    iconEntry->filename = pngPath;
                    // Notice we ensure that pixmap entries always come before
                    // scalable to preserve search order afterwards
                    info.entries.insert(info.entries.begin(), std::move(iconEntry));
                } else if (m_supportsSvg) {
                    const QString svgPath = subDir + svgIconName;
                    if (QFile::exists(svgPath)) {
                        auto iconEntry = std::make_unique<ScalableEntry>();
                        iconEntry->dir = dirInfo;
                        iconEntry->filename = svgPath;
                        info.entries.push_back(std::move(iconEntry));
                    }
                }
            }
        }

        if (!info.entries.empty()) {
            info.iconName = iconNameFallback.toString();
        }
    }

    if (info.entries.empty()) {
        const QStringList parents = theme.parents();
        qCDebug(lcIconLoader) << "Did not find matching icons in theme;"
            << "trying parent themes" << parents
            << "skipping visited" << visited;

        // Search recursively through inherited themes
        for (int i = 0 ; i < parents.size() ; ++i) {

            const QString parentTheme = parents.at(i).trimmed();

            if (!visited.contains(parentTheme)) // guard against recursion
                info = findIconHelper(parentTheme, iconName, visited, QIconLoader::NoFallBack);

            if (!info.entries.empty()) // success
                break;
        }
    }

    if (rule == QIconLoader::FallBack && info.entries.empty()) {
        // If it's possible - find next fallback for the icon
        const int indexOfDash = iconNameFallback.lastIndexOf(u'-');
        if (indexOfDash != -1) {
            qCDebug(lcIconLoader) << "Did not find matching icons in all themes;"
                                  << "trying dash fallback";
            iconNameFallback.truncate(indexOfDash);
            QStringList _visited;
            info = findIconHelper(themeName, iconNameFallback.toString(), _visited, QIconLoader::FallBack);
        }
    }

    return info;
}